

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O1

void wasm::SimplifyLocals<true,_false,_true>::visitPost
               (SimplifyLocals<true,_false,_true> *self,Expression **currp)

{
  _Rb_tree_header *p_Var1;
  LocalGet *curr;
  LocalSet *this;
  Expression *pEVar2;
  PassRunner *pPVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  LocalGet *curr_00;
  const_iterator __position;
  Drop *output;
  LocalSet *set;
  bool bVar6;
  pair<unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo> local_4a0;
  SinkableInfo local_330;
  undefined1 local_1c8 [8];
  EffectAnalyzer effects;
  LocalGet originalGet;
  _Rb_tree_color local_34 [2];
  Index index;
  
  curr = (LocalGet *)*currp;
  effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
       CONCAT71(effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,8);
  curr_00 = curr;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id == LocalGetId)
  {
    curr_00 = (LocalGet *)&effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
    effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
         *(size_t *)&(curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression;
    optimizeLocalGet(self,curr);
  }
  set = (LocalSet *)*currp;
  if ((((LocalSet *)*currp)->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id
      != LocalSetId) {
    set = (LocalSet *)0x0;
  }
  if (set != (LocalSet *)0x0) {
    p_Var5 = (self->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var1 = &(self->sinkables)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    if (p_Var5 != (_Base_ptr)0x0) {
      do {
        bVar6 = p_Var5[1]._M_color < set->index;
        if (!bVar6) {
          p_Var4 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[bVar6];
      } while (p_Var5 != (_Base_ptr)0x0);
    }
    __position._M_node = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
       (__position._M_node = p_Var4, set->index < p_Var4[1]._M_color)) {
      __position._M_node = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)__position._M_node != p_Var1) {
      this = *(LocalSet **)__position._M_node[1]._M_parent;
      if ((this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id !=
          LocalSetId) {
        __assert_fail("int(_id) == int(T::SpecificId)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                      ,0x31b,"T *wasm::Expression::cast() [T = wasm::LocalSet]");
      }
      bVar6 = LocalSet::isTee(this);
      if (bVar6) {
        __assert_fail("!previous->isTee()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                      ,0x1a1,
                      "static void wasm::SimplifyLocals<true, false>::visitPost(SimplifyLocals<allowTee, allowStructure, allowNesting> *, Expression **) [allowTee = true, allowStructure = false, allowNesting = true]"
                     );
      }
      pEVar2 = this->value;
      (this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = DropId;
      (this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
      *(Expression **)&this->index = pEVar2;
      Drop::finalize((Drop *)this);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>_>_>
      ::_M_erase_aux(&(self->sinkables)._M_t,__position);
      self->anotherCycle = true;
    }
  }
  pPVar3 = (self->
           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
           ).super_Pass.runner;
  effects._0_8_ =
       (self->
       super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
       ).
       super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
       .
       super_PostWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
       .
       super_Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
       .currModule;
  local_1c8[0] = (pPVar3->options).ignoreImplicitTraps;
  effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effects.localsRead;
  local_1c8[1] = (pPVar3->options).trapsNeverHappen;
  effects.module._0_4_ = (((Module *)effects._0_8_)->features).features;
  effects.module._4_2_ = 0;
  effects.localsRead._M_t._M_impl._0_4_ = 0;
  effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effects.localsWritten;
  effects.localsWritten._M_t._M_impl._0_4_ = 0;
  effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effects.mutableGlobalsRead;
  effects.mutableGlobalsRead._M_t._M_impl._0_4_ = 0;
  effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effects.globalsWritten;
  effects.globalsWritten._M_t._M_impl._0_4_ = 0;
  effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effects.breakTargets;
  effects.breakTargets._M_t._M_impl._0_4_ = 0;
  effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effects.readsMemory = false;
  effects.writesMemory = false;
  effects.readsTable = false;
  effects.writesTable = false;
  effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  effects.trap = false;
  effects.implicitTrap = false;
  effects.isAtomic = false;
  effects.throws_ = false;
  effects._228_4_ = 0;
  effects.tryDepth._0_7_ = 0;
  effects._239_4_ = 0;
  effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effects.delegateTargets;
  effects.delegateTargets._M_t._M_impl._0_4_ = 0;
  effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  bVar6 = EffectAnalyzer::checkPost((EffectAnalyzer *)local_1c8,(Expression *)curr_00);
  if (bVar6) {
    checkInvalidations(self,(EffectAnalyzer *)local_1c8);
  }
  if ((set != (LocalSet *)0x0) && (bVar6 = canSink(self,set), bVar6)) {
    local_34[0] = set->index;
    p_Var1 = &(self->sinkables)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = (self->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &p_Var1->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[bVar6]) {
      bVar6 = p_Var5[1]._M_color < local_34[0];
      if (!bVar6) {
        p_Var4 = p_Var5;
      }
    }
    p_Var5 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var5 = p_Var4, local_34[0] < p_Var4[1]._M_color)
       ) {
      p_Var5 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      __assert_fail("self->sinkables.count(index) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x1b2,
                    "static void wasm::SimplifyLocals<true, false>::visitPost(SimplifyLocals<allowTee, allowStructure, allowNesting> *, Expression **) [allowTee = true, allowStructure = false, allowNesting = true]"
                   );
    }
    local_330.item = currp;
    EffectAnalyzer::EffectAnalyzer
              (&local_330.effects,
               &((self->
                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                 ).super_Pass.runner)->options,
               (self->
               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
               ).
               super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
               .
               super_PostWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
               .
               super_Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
               .currModule,*currp);
    std::pair<unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>::
    pair<unsigned_int_&,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo,_true>
              (&local_4a0,local_34,&local_330);
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>,std::_Select1st<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>>
    ::_M_emplace_unique<std::pair<unsigned_int,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>,std::_Select1st<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>>
                *)&self->sinkables,&local_4a0);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_4a0.second.effects.delegateTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_4a0.second.effects.breakTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_4a0.second.effects.globalsWritten._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_4a0.second.effects.mutableGlobalsRead._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_4a0.second.effects.localsWritten._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_4a0.second.effects.localsRead._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_330.effects.delegateTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_330.effects.breakTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_330.effects.globalsWritten._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_330.effects.mutableGlobalsRead._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_330.effects.localsWritten._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_330.effects.localsRead._M_t);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&effects.danglingPop);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&effects.features);
  return;
}

Assistant:

static void
  visitPost(SimplifyLocals<allowTee, allowStructure, allowNesting>* self,
            Expression** currp) {
    // Handling invalidations in the case where the current node is a get
    // that we sink into is not trivial in general. In the simple case,
    // all current sinkables are compatible with each other (otherwise one
    // would have invalidated a previous one, and removed it). Given that, if
    // we sink one of the sinkables, then that new code cannot invalidate any
    // other sinkable - we've already compared them. However, a tricky case
    // is when a sinkable contains another sinkable,
    //
    //  (local.set $x
    //   (block (result i32)
    //    (A (local.get $y))
    //    (local.set $y B)
    //   )
    //  )
    //  (C (local.get $y))
    //  (D (local.get $x))
    //
    // If we sink the set of $y, we have
    //
    //  (local.set $x
    //   (block (result i32)
    //    (A (local.get $y))
    //    (nop)
    //   )
    //  )
    //  (C B)
    //  (D (local.get $x))
    //
    // There is now a risk that the set of $x should be invalidated, because
    // if we sink it then A may happen after B (imagine that B contains
    // something dangerous for that). To verify the risk, we could recursively
    // scan all of B, but that is less efficient. Instead, the key thing is
    // that if we sink out an inner part of a set, we should just leave further
    // work on it to a later iteration. This is achieved by checking for
    // invalidation on the original node, the local.get $y, which is guaranteed
    // to invalidate the parent whose inner part was removed (since the inner
    // part has a set, and the original node is a get of that same local).
    //
    // To implement this, if the current node is a get, note it and use it
    // for invalidations later down. We must note it since optimizing the get
    // may perform arbitrary changes to the graph, including reuse the get.

    Expression* original = *currp;

    LocalGet originalGet;

    if (auto* get = (*currp)->dynCast<LocalGet>()) {
      // Note: no visitor for LocalGet, so that we can handle it here.
      originalGet = *get;
      original = &originalGet;
      self->optimizeLocalGet(get);
    }

    // perform main LocalSet processing here, since we may be the result of
    // replaceCurrent, i.e., no visitor for LocalSet, like LocalGet above.
    auto* set = (*currp)->dynCast<LocalSet>();

    if (set) {
      // if we see a set that was already potentially-sinkable, then the
      // previous store is dead, leave just the value
      auto found = self->sinkables.find(set->index);
      if (found != self->sinkables.end()) {
        auto* previous = (*found->second.item)->template cast<LocalSet>();
        assert(!previous->isTee());
        auto* previousValue = previous->value;
        Drop* drop = ExpressionManipulator::convert<LocalSet, Drop>(previous);
        drop->value = previousValue;
        drop->finalize();
        self->sinkables.erase(found);
        self->anotherCycle = true;
      }
    }

    EffectAnalyzer effects(self->getPassOptions(), *self->getModule());
    if (effects.checkPost(original)) {
      self->checkInvalidations(effects);
    }

    if (set && self->canSink(set)) {
      Index index = set->index;
      assert(self->sinkables.count(index) == 0);
      self->sinkables.emplace(std::pair{
        index,
        SinkableInfo(currp, self->getPassOptions(), *self->getModule())});
    }

    if (!allowNesting) {
      self->expressionStack.pop_back();
    }
  }